

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall TPZSkylMatrix<double>::Subst_Diag(TPZSkylMatrix<double> *this,TPZFMatrix<double> *B)

{
  int64_t col;
  long lVar1;
  int64_t iVar2;
  long lVar3;
  double **ppdVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int64_t k;
  double *BPtr;
  int64_t j;
  int64_t dimension;
  long in_stack_ffffffffffffffc8;
  TPZFMatrix<double> *in_stack_ffffffffffffffd0;
  long local_28;
  int local_4;
  
  col = TPZBaseMatrix::Rows(in_RSI);
  lVar1 = (**(code **)(*in_RDI + 0x60))();
  if ((col == lVar1) && ((char)in_RDI[3] == '\x04')) {
    lVar1 = (**(code **)(*in_RDI + 0x60))();
    if (lVar1 == 0) {
      local_4 = 1;
    }
    else {
      local_28 = 0;
      while( true ) {
        iVar2 = TPZBaseMatrix::Cols(in_RSI);
        if (iVar2 <= local_28) break;
        in_stack_ffffffffffffffd0 =
             (TPZFMatrix<double> *)
             TPZFMatrix<double>::operator()(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,col)
        ;
        in_stack_ffffffffffffffc8 = 0;
        while (in_stack_ffffffffffffffc8 < lVar1) {
          lVar3 = in_stack_ffffffffffffffc8 + 1;
          ppdVar4 = TPZVec<double_*>::operator[]
                              ((TPZVec<double_*> *)(in_RDI + 4),in_stack_ffffffffffffffc8);
          (in_stack_ffffffffffffffd0->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable =
               (_func_int **)
               ((double)(in_stack_ffffffffffffffd0->super_TPZMatrix<double>).super_TPZBaseMatrix.
                        super_TPZSavable._vptr_TPZSavable / **ppdVar4);
          in_stack_ffffffffffffffc8 = lVar3;
          in_stack_ffffffffffffffd0 =
               (TPZFMatrix<double> *)
               &(in_stack_ffffffffffffffd0->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        }
        local_28 = local_28 + 1;
      }
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ELDLt) return( 0 );
    int64_t dimension = this->Dim();
    if (!dimension) {
        return 1;
    }
    for ( int64_t j = 0; j < B->Cols(); j++ ) {
        TVar *BPtr = &(*B)(0,j);
        int64_t k=0;
        while(k < dimension) *BPtr++ /= *(fElem[k++]);
    }
    return( 1 );
}